

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O3

char32_t QChar::toCaseFolded(char32_t ucs4)

{
  uint uVar1;
  short sVar2;
  uint uVar3;
  
  if ((uint)ucs4 < 0x110000) {
    uVar3 = 0xff;
    if ((uint)ucs4 < 0x11000) {
      uVar3 = 0x1f;
    }
    uVar1 = (uint)ucs4 >> 5;
    if (0x10fff < (uint)ucs4) {
      uVar1 = ((uint)(ucs4 + L'\xfffef000') >> 8) + 0x880;
    }
    sVar2 = (short)((uint)(int)(short)*(ushort *)
                                       (QUnicodeTables::uc_properties +
                                       (ulong)*(ushort *)
                                               (QUnicodeTables::uc_property_trie +
                                               (ulong)(uint)((uVar3 & ucs4) +
                                                            (uint)*(ushort *)
                                                                   (QUnicodeTables::uc_property_trie
                                                                   + (ulong)uVar1 * 2)) * 2) * 0x14
                                       + 0xe) >> 1);
    if ((*(ushort *)
          (QUnicodeTables::uc_properties +
          (ulong)*(ushort *)
                  (QUnicodeTables::uc_property_trie +
                  (ulong)(uint)((uVar3 & ucs4) +
                               (uint)*(ushort *)
                                      (QUnicodeTables::uc_property_trie + (ulong)uVar1 * 2)) * 2) *
          0x14 + 0xe) & 1) == 0) {
      ucs4 = ucs4 + sVar2;
    }
    else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar2 * 2) == 1) {
      return (char32_t)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar2 * 2 + 2);
    }
  }
  return ucs4;
}

Assistant:

char32_t QChar::toCaseFolded(char32_t ucs4) noexcept
{
    if (ucs4 > LastValidCodePoint)
        return ucs4;
    return convertCase_helper(ucs4, QUnicodeTables::CaseFold);
}